

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O1

void __thiscall SHMException::SHMException(SHMException *this,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__SHMException_00106cb0;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

SHMException::SHMException( const std::string &message ) : std::exception(),
                                                           message( message )
{
}